

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

int __thiscall
deqp::gles31::Functional::anon_unknown_1::CommonEdgeCase::init
          (CommonEdgeCase *this,EVP_PKEY_CTX *ctx)

{
  Context *this_00;
  RenderContext *renderCtx;
  bool bVar1;
  int iVar2;
  RenderTarget *renderTarget;
  ShaderProgram *this_01;
  ProgramSources *pPVar3;
  TestError *this_02;
  char *pcVar4;
  char *pcVar5;
  undefined1 in_R8B;
  bool *__rhs;
  char *pcVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d0;
  string fragmentShaderTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  SharedPtr<const_glu::ShaderProgram> local_270;
  undefined1 local_260 [40];
  undefined1 local_238 [40];
  undefined1 local_210 [40];
  undefined1 local_1e8 [40];
  string local_1c0;
  string tessellationEvaluationTemplate;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  string tessellationControlTemplate;
  string vertexShaderTemplate;
  ProgramSources local_100;
  
  checkTessellationSupport((this->super_TestCase).m_context);
  if (this->m_caseType == CASETYPE_PRECISE) {
    checkGPUShader5Support((this->super_TestCase).m_context);
  }
  renderTarget = Context::getRenderTarget((this->super_TestCase).m_context);
  checkRenderTargetSize(renderTarget,0x100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vertexShaderTemplate,
             "${GLSL_VERSION_DECL}\n\nin highp vec2 in_v_position;\nin highp float in_v_tessParam;\n\nout highp vec2 in_tc_position;\nout highp float in_tc_tessParam;\n\nvoid main (void)\n{\n\tin_tc_position = in_v_position;\n\tin_tc_tessParam = in_v_tessParam;\n}\n"
             ,(allocator<char> *)&local_100);
  pcVar6 = "${GPU_SHADER5_REQUIRE}\n";
  __rhs = SSBOArrayLengthTests::init::arraysSized + 1;
  pcVar5 = SSBOArrayLengthTests::init::arraysSized + 1;
  if (this->m_caseType == CASETYPE_PRECISE) {
    pcVar5 = "${GPU_SHADER5_REQUIRE}\n";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2d0,pcVar5,(allocator<char> *)&local_1c0);
  std::operator+(&fragmentShaderTemplate,"${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n",
                 &local_2d0);
  std::operator+(&tessellationEvaluationTemplate,&fragmentShaderTemplate,"\nlayout (vertices = ");
  pcVar5 = (char *)0x0;
  if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
    pcVar5 = "4";
  }
  pcVar4 = "3";
  if (this->m_primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
    pcVar4 = pcVar5;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,pcVar4,(allocator<char> *)&local_290);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                 &tessellationEvaluationTemplate,&local_2f0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                 ") out;\n\nin highp vec2 in_tc_position[];\nin highp float in_tc_tessParam[];\n\nout highp vec2 in_te_position[];\n\n"
                );
  pcVar5 = "precise gl_TessLevelOuter;\n\n";
  if (this->m_caseType != CASETYPE_PRECISE) {
    pcVar5 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                 pcVar5);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                 "void main (void)\n{\n\tin_te_position[gl_InvocationID] = in_tc_position[gl_InvocationID];\n\n\tgl_TessLevelInner[0] = 5.0;\n\tgl_TessLevelInner[1] = 5.0;\n\n"
                );
  pcVar5 = (char *)0x0;
  if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
    pcVar5 = 
    "\tgl_TessLevelOuter[0] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[0] + in_tc_tessParam[2]);\n\tgl_TessLevelOuter[1] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[1] + in_tc_tessParam[0]);\n\tgl_TessLevelOuter[2] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[3] + in_tc_tessParam[1]);\n\tgl_TessLevelOuter[3] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[2] + in_tc_tessParam[3]);\n"
    ;
  }
  pcVar4 = 
  "\tgl_TessLevelOuter[0] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[1] + in_tc_tessParam[2]);\n\tgl_TessLevelOuter[1] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[2] + in_tc_tessParam[0]);\n\tgl_TessLevelOuter[2] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[0] + in_tc_tessParam[1]);\n"
  ;
  if (this->m_primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
    pcVar4 = pcVar5;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                 pcVar4);
  std::operator+(&tessellationControlTemplate,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 "}\n");
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::string::~string((string *)local_238);
  std::__cxx11::string::~string((string *)local_260);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)&tessellationEvaluationTemplate);
  std::__cxx11::string::~string((string *)&fragmentShaderTemplate);
  std::__cxx11::string::~string((string *)&local_2d0);
  if (this->m_caseType != CASETYPE_PRECISE) {
    pcVar6 = SSBOArrayLengthTests::init::arraysSized + 1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,pcVar6,(allocator<char> *)&local_270);
  std::operator+(&local_2d0,"${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n",&local_2f0);
  std::operator+(&fragmentShaderTemplate,&local_2d0,"\n");
  pcVar5 = (char *)0x0;
  (anonymous_namespace)::getTessellationEvaluationInLayoutString_abi_cxx11_
            (&local_1c0,(_anonymous_namespace_ *)(ulong)this->m_primitiveType,this->m_spacing,
             SPACINGMODE_EQUAL,(bool)in_R8B);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                 &fragmentShaderTemplate,&local_1c0);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_260,
                 "\nin highp vec2 in_te_position[];\n\nout mediump vec4 in_f_color;\n\n");
  if (this->m_caseType == CASETYPE_PRECISE) {
    __rhs = (bool *)0x855e86;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                 __rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210,
                 "void main (void)\n{\n");
  if (this->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,
               "\thighp vec2 pos = gl_TessCoord.x*in_te_position[0] + gl_TessCoord.y*in_te_position[1] + gl_TessCoord.z*in_te_position[2];\n\n\thighp float f = sqrt(3.0 * min(gl_TessCoord.x, min(gl_TessCoord.y, gl_TessCoord.z))) * 0.5 + 0.5;\n\tin_f_color = vec4(gl_TessCoord*f, 1.0);\n"
               ,(allocator<char> *)&local_180);
    bVar1 = false;
  }
  else if (this->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
    local_160._M_dataplus._M_p = (pointer)&local_160.field_2;
    local_160._M_string_length = 0;
    local_160.field_2._M_local_buf[0] = '\0';
    pcVar5 = (char *)0x0;
    if (this->m_caseType == CASETYPE_PRECISE) {
      pcVar5 = 
      "\thighp vec2 a = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[0];\n\thighp vec2 b = (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[1];\n\thighp vec2 c = (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[2];\n\thighp vec2 d = (    gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[3];\n\thighp vec2 pos = a+b+c+d;\n"
      ;
    }
    pcVar6 = 
    "\thighp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[0]\n\t               + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[1]\n\t               + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[2]\n\t               + (    gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[3];\n"
    ;
    if (this->m_caseType != CASETYPE_BASIC) {
      pcVar6 = pcVar5;
    }
    std::operator+(&local_180,&local_160,pcVar6);
    std::operator+(&local_290,&local_180,
                   "\n\thighp float f = sqrt(1.0 - 2.0 * max(abs(gl_TessCoord.x - 0.5), abs(gl_TessCoord.y - 0.5)))*0.5 + 0.5;\n\tin_f_color = vec4(0.1, gl_TessCoord.xy*f, 1.0);\n"
                  );
    bVar1 = true;
  }
  else {
    bVar1 = false;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_290,(char *)0x0,(allocator<char> *)&local_180);
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e8,
                 &local_290);
  std::operator+(&tessellationEvaluationTemplate,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_100,
                 "\n\t// Offset the position slightly, based on the parity of the bits in the float representation.\n\t// This is done to detect possible small differences in edge vertex positions between patches.\n\tuvec2 bits = floatBitsToUint(pos);\n\tuint numBits = 0u;\n\tfor (uint i = 0u; i < 32u; i++)\n\t\tnumBits += ((bits[0] >> i) & 1u) + ((bits[1] >> i) & 1u);\n\tpos += float(numBits&1u)*0.04;\n\n\tgl_Position = vec4(pos, 0.0, 1.0);\n}\n"
                );
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_290);
  if (bVar1) {
    std::__cxx11::string::~string((string *)&local_180);
    std::__cxx11::string::~string((string *)&local_160);
  }
  std::__cxx11::string::~string((string *)local_1e8);
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::string::~string((string *)local_238);
  std::__cxx11::string::~string((string *)local_260);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&fragmentShaderTemplate);
  std::__cxx11::string::~string((string *)&local_2d0);
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&fragmentShaderTemplate,
             "${GLSL_VERSION_DECL}\n\nlayout (location = 0) out mediump vec4 o_color;\n\nin mediump vec4 in_f_color;\n\nvoid main (void)\n{\n\to_color = in_f_color;\n}\n"
             ,(allocator<char> *)&local_100);
  this_01 = (ShaderProgram *)operator_new(0xd0);
  this_00 = (this->super_TestCase).m_context;
  renderCtx = this_00->m_renderCtx;
  memset(&local_100,0,0xac);
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_100.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_100._193_8_ = 0;
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2d0,(_anonymous_namespace_ *)this_00,
             (Context *)vertexShaderTemplate._M_dataplus._M_p,pcVar5);
  glu::VertexSource::VertexSource((VertexSource *)local_1e8,&local_2d0);
  pPVar3 = glu::ProgramSources::operator<<(&local_100,(ShaderSource *)local_1e8);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_2f0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)tessellationControlTemplate._M_dataplus._M_p,pcVar5);
  glu::TessellationControlSource::TessellationControlSource
            ((TessellationControlSource *)local_210,&local_2f0);
  pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_210);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_1c0,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)tessellationEvaluationTemplate._M_dataplus._M_p,pcVar5);
  glu::TessellationEvaluationSource::TessellationEvaluationSource
            ((TessellationEvaluationSource *)local_238,&local_1c0);
  pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_238);
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_290,(_anonymous_namespace_ *)(this->super_TestCase).m_context,
             (Context *)fragmentShaderTemplate._M_dataplus._M_p,pcVar5);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_260,&local_290);
  pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_260);
  glu::ShaderProgram::ShaderProgram(this_01,renderCtx,pPVar3);
  de::SharedPtr<const_glu::ShaderProgram>::SharedPtr(&local_270,this_01);
  de::SharedPtr<const_glu::ShaderProgram>::operator=(&this->m_program,&local_270);
  de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr(&local_270);
  std::__cxx11::string::~string((string *)(local_260 + 8));
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::~string((string *)(local_238 + 8));
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)(local_210 + 8));
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::string::~string((string *)(local_1e8 + 8));
  std::__cxx11::string::~string((string *)&local_2d0);
  glu::ProgramSources::~ProgramSources(&local_100);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  (this->m_program).m_ptr);
  if ((((this->m_program).m_ptr)->m_program).m_info.linkOk == false) {
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Program compilation failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
               ,0x6b1);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::~string((string *)&fragmentShaderTemplate);
  std::__cxx11::string::~string((string *)&tessellationEvaluationTemplate);
  std::__cxx11::string::~string((string *)&tessellationControlTemplate);
  iVar2 = std::__cxx11::string::~string((string *)&vertexShaderTemplate);
  return iVar2;
}

Assistant:

void CommonEdgeCase::init (void)
{
	checkTessellationSupport(m_context);

	if (m_caseType == CASETYPE_PRECISE)
		checkGPUShader5Support(m_context);

	checkRenderTargetSize(m_context.getRenderTarget(), RENDER_SIZE);

	std::string vertexShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "in highp vec2 in_v_position;\n"
													 "in highp float in_v_tessParam;\n"
													 "\n"
													 "out highp vec2 in_tc_position;\n"
													 "out highp float in_tc_tessParam;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	in_tc_position = in_v_position;\n"
													 "	in_tc_tessParam = in_v_tessParam;\n"
												 "}\n");

	std::string tessellationControlTemplate		("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 + string(m_caseType == CASETYPE_PRECISE ? "${GPU_SHADER5_REQUIRE}\n" : "") +
													 "\n"
													 "layout (vertices = " + string(m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? "3" : m_primitiveType == TESSPRIMITIVETYPE_QUADS ? "4" : DE_NULL) + ") out;\n"
													 "\n"
													 "in highp vec2 in_tc_position[];\n"
													 "in highp float in_tc_tessParam[];\n"
													 "\n"
													 "out highp vec2 in_te_position[];\n"
													 "\n"
													 + (m_caseType == CASETYPE_PRECISE ? "precise gl_TessLevelOuter;\n\n" : "") +
													 "void main (void)\n"
													 "{\n"
													 "	in_te_position[gl_InvocationID] = in_tc_position[gl_InvocationID];\n"
													 "\n"
													 "	gl_TessLevelInner[0] = 5.0;\n"
													 "	gl_TessLevelInner[1] = 5.0;\n"
													 "\n"
													 + (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ?
														"	gl_TessLevelOuter[0] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[1] + in_tc_tessParam[2]);\n"
														"	gl_TessLevelOuter[1] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[2] + in_tc_tessParam[0]);\n"
														"	gl_TessLevelOuter[2] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[0] + in_tc_tessParam[1]);\n"
													  : m_primitiveType == TESSPRIMITIVETYPE_QUADS ?
														"	gl_TessLevelOuter[0] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[0] + in_tc_tessParam[2]);\n"
														"	gl_TessLevelOuter[1] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[1] + in_tc_tessParam[0]);\n"
														"	gl_TessLevelOuter[2] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[3] + in_tc_tessParam[1]);\n"
														"	gl_TessLevelOuter[3] = 1.0 + 59.0 * 0.5 * (in_tc_tessParam[2] + in_tc_tessParam[3]);\n"
													  : DE_NULL) +
												 "}\n");

	std::string tessellationEvaluationTemplate	("${GLSL_VERSION_DECL}\n"
												 "${TESSELLATION_SHADER_REQUIRE}\n"
												 + string(m_caseType == CASETYPE_PRECISE ? "${GPU_SHADER5_REQUIRE}\n" : "") +
													 "\n"
													 + getTessellationEvaluationInLayoutString(m_primitiveType, m_spacing) +
													 "\n"
													 "in highp vec2 in_te_position[];\n"
													 "\n"
													 "out mediump vec4 in_f_color;\n"
													 "\n"
													 + (m_caseType == CASETYPE_PRECISE ? "precise gl_Position;\n\n" : "") +
													 "void main (void)\n"
													 "{\n"
													 + (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ?
														"	highp vec2 pos = gl_TessCoord.x*in_te_position[0] + gl_TessCoord.y*in_te_position[1] + gl_TessCoord.z*in_te_position[2];\n"
														"\n"
														"	highp float f = sqrt(3.0 * min(gl_TessCoord.x, min(gl_TessCoord.y, gl_TessCoord.z))) * 0.5 + 0.5;\n"
														"	in_f_color = vec4(gl_TessCoord*f, 1.0);\n"
													  : m_primitiveType == TESSPRIMITIVETYPE_QUADS ?
													    string()
														+ (m_caseType == CASETYPE_BASIC ?
															"	highp vec2 pos = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[0]\n"
															"	               + (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[1]\n"
															"	               + (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[2]\n"
															"	               + (    gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[3];\n"
														 : m_caseType == CASETYPE_PRECISE ?
															"	highp vec2 a = (1.0-gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[0];\n"
															"	highp vec2 b = (    gl_TessCoord.x)*(1.0-gl_TessCoord.y)*in_te_position[1];\n"
															"	highp vec2 c = (1.0-gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[2];\n"
															"	highp vec2 d = (    gl_TessCoord.x)*(    gl_TessCoord.y)*in_te_position[3];\n"
															"	highp vec2 pos = a+b+c+d;\n"
														 : DE_NULL) +
														"\n"
														"	highp float f = sqrt(1.0 - 2.0 * max(abs(gl_TessCoord.x - 0.5), abs(gl_TessCoord.y - 0.5)))*0.5 + 0.5;\n"
														"	in_f_color = vec4(0.1, gl_TessCoord.xy*f, 1.0);\n"
													  : DE_NULL) +
													 "\n"
													 "	// Offset the position slightly, based on the parity of the bits in the float representation.\n"
													 "	// This is done to detect possible small differences in edge vertex positions between patches.\n"
													 "	uvec2 bits = floatBitsToUint(pos);\n"
													 "	uint numBits = 0u;\n"
													 "	for (uint i = 0u; i < 32u; i++)\n"
													 "		numBits += ((bits[0] >> i) & 1u) + ((bits[1] >> i) & 1u);\n"
													 "	pos += float(numBits&1u)*0.04;\n"
													 "\n"
													 "	gl_Position = vec4(pos, 0.0, 1.0);\n"
												 "}\n");

	std::string fragmentShaderTemplate			("${GLSL_VERSION_DECL}\n"
													 "\n"
													 "layout (location = 0) out mediump vec4 o_color;\n"
													 "\n"
													 "in mediump vec4 in_f_color;\n"
													 "\n"
													 "void main (void)\n"
													 "{\n"
													 "	o_color = in_f_color;\n"
												 "}\n");

	m_program = SharedPtr<const ShaderProgram>(new ShaderProgram(m_context.getRenderContext(), glu::ProgramSources()
			<< glu::VertexSource					(specializeShader(m_context, vertexShaderTemplate.c_str()))
			<< glu::TessellationControlSource		(specializeShader(m_context, tessellationControlTemplate.c_str()))
			<< glu::TessellationEvaluationSource	(specializeShader(m_context, tessellationEvaluationTemplate.c_str()))
			<< glu::FragmentSource					(specializeShader(m_context, fragmentShaderTemplate.c_str()))));

	m_testCtx.getLog() << *m_program;
	if (!m_program->isOk())
		TCU_FAIL("Program compilation failed");
}